

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall
QtPrivate::QCalendarDelegate::paint
          (QCalendarDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  long *plVar1;
  QDate QVar2;
  long in_FS_OFFSET;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QCalendarModel::dateForCell(this->calendarWidgetPrivate->m_model,index->r,index->c);
  if (QVar2.jd + 0xb69eeff91fU < 0x16d3e147974) {
    QStyleOptionViewItem::operator=(&this->storedOption,option);
    local_48 = (option->super_QStyleOption).rect.x1.m_i;
    iStack_44 = (option->super_QStyleOption).rect.y1.m_i;
    iStack_40 = (option->super_QStyleOption).rect.x2.m_i;
    iStack_3c = (option->super_QStyleOption).rect.y2.m_i;
    plVar1 = *(long **)&(this->calendarWidgetPrivate->super_QWidgetPrivate).field_0x8;
    (**(code **)(*plVar1 + 0x1a0))(plVar1,painter,&local_48,QVar2.jd);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QStyledItemDelegate::paint((QStyledItemDelegate *)this,painter,option,index);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarDelegate::paint(QPainter *painter, const QStyleOptionViewItem &option,
            const QModelIndex &index) const
{
    QDate date = calendarWidgetPrivate->m_model->dateForCell(index.row(), index.column());
    if (date.isValid()) {
        storedOption = option;
        QRect rect = option.rect;
        calendarWidgetPrivate->paintCell(painter, rect, date);
    } else {
        QStyledItemDelegate::paint(painter, option, index);
    }
}